

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportWarning
          (ParserImpl *this,int line,int col,string_view message)

{
  string_view v;
  LogMessage *pLVar1;
  string_view sVar2;
  bool local_139;
  bool local_d1;
  LogMessage local_90;
  uint32_t local_80;
  byte local_79;
  uint32_t COUNTER_1;
  bool absl_log_internal_stateful_condition_do_log_1;
  size_t sStack_70;
  string_view local_68;
  LogMessage local_40;
  uint32_t local_30;
  byte local_29;
  uint32_t COUNTER;
  int iStack_24;
  bool absl_log_internal_stateful_condition_do_log;
  int col_local;
  int line_local;
  ParserImpl *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (ParserImpl *)message._M_len;
  COUNTER = col;
  iStack_24 = line;
  _col_local = this;
  if (this->error_collector_ == (ErrorCollector *)0x0) {
    if (line < 0) {
      local_79 = 1;
      while (local_79 != 0) {
        while( true ) {
          local_139 = false;
          if (local_79 != 0) {
            local_139 = absl::lts_20250127::log_internal::LogEveryPow2State::ShouldLog
                                  (&ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)
                                    ::absl_log_internal_stateful_condition_state);
          }
          if (local_139 == false) break;
          local_80 = absl::lts_20250127::log_internal::LogEveryPow2State::counter
                               (&ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)
                                 ::absl_log_internal_stateful_condition_state);
          while ((local_79 & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&local_90,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                       ,0x18e);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [29])"Warning parsing text-format ");
            sVar2 = Descriptor::full_name(this->root_message_type_);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [7])" (N = ");
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_80);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [4])0xba052d);
            sVar2._M_str = (char *)message_local._M_len;
            sVar2._M_len = (size_t)this_local;
            absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
            absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_90);
            local_79 = 0;
          }
          local_79 = 0;
        }
        local_79 = 0;
      }
    }
    else {
      local_29 = 1;
      while (local_29 != 0) {
        while( true ) {
          local_d1 = false;
          if (local_29 != 0) {
            local_d1 = absl::lts_20250127::log_internal::LogEveryPow2State::ShouldLog
                                 (&ReportWarning::absl_log_internal_stateful_condition_state);
          }
          if (local_d1 == false) break;
          local_30 = absl::lts_20250127::log_internal::LogEveryPow2State::counter
                               (&ReportWarning::absl_log_internal_stateful_condition_state);
          while ((local_29 & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                       ,0x189);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [29])"Warning parsing text-format ");
            sVar2 = Descriptor::full_name(this->root_message_type_);
            local_68 = sVar2;
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [3])0xbe0b13);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,iStack_24 + 1);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [2])0xb36c8c);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,COUNTER + 1);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [7])" (N = ");
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_30);
            pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar1,(char (*) [4])0xba052d);
            _COUNTER_1 = this_local;
            sStack_70 = message_local._M_len;
            v._M_str = (char *)message_local._M_len;
            v._M_len = (size_t)this_local;
            absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
            absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
            local_29 = 0;
          }
          local_29 = 0;
        }
        local_29 = 0;
      }
    }
  }
  else {
    (*this->error_collector_->_vptr_ErrorCollector[3])
              (this->error_collector_,(ulong)(uint)line,(ulong)(uint)col,this_local,
               message_local._M_len);
  }
  return;
}

Assistant:

void ReportWarning(int line, int col, const absl::string_view message) {
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << ": " << (line + 1) << ":" << (col + 1) << " (N = " << COUNTER
            << "): " << message;
      } else {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << " (N = " << COUNTER << "): " << message;
      }
    } else {
      error_collector_->RecordWarning(line, col, message);
    }
  }